

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall
t_json_generator::write_type_spec_entry(t_json_generator *this,char *name,t_type *ttype)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  write_key_and(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  write_type_spec(this,ttype);
  return;
}

Assistant:

void t_json_generator::write_type_spec_entry(const char* name, t_type* ttype) {
  write_key_and(name);
  write_type_spec(ttype);
}